

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

size_t utf8_strlen(char *s)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (*s != '\0') {
    pcVar3 = s + 1;
    sVar2 = 0;
    do {
      sVar2 = sVar2 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
    return sVar2;
  }
  return 0;
}

Assistant:

size_t utf8_strlen(const char *s)
{
	size_t i = 0, j = 0;
	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) j++;
		i++;
	}
	return j;
}